

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O2

int archive_write_zip_finish_entry(archive_write *a)

{
  compression cVar1;
  zip_conflict *zip;
  ulong uVar2;
  int64_t iVar3;
  int iVar4;
  wchar_t wVar5;
  long lVar6;
  time_t tVar7;
  uchar *puVar8;
  sbyte sVar9;
  char *pcVar10;
  size_t sVar11;
  sbyte sVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  ulong uVar16;
  byte bVar17;
  uchar *p;
  size_t length;
  undefined1 *puVar18;
  size_t outl;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61 [9];
  archive_hmac_sha1_ctx *local_58;
  code *local_50;
  archive_crypto_ctx *local_48;
  code *local_40;
  size_t hmac_len;
  
  zip = (zip_conflict *)a->format_data;
  cVar1 = zip->entry_compression;
  if (cVar1 == COMPRESSION_DEFLATE) {
    local_40 = aes_ctr_update;
    local_48 = &zip->cctx;
    local_50 = __hmac_sha1_update;
    local_58 = &zip->hctx;
    while( true ) {
      iVar4 = deflate(&zip->stream,4);
      if (iVar4 == -2) {
        return -0x1e;
      }
      sVar11 = zip->len_buf - (ulong)(zip->stream).lzma.options.lp;
      if (zip->tctx_valid == '\0') {
        if (zip->cctx_valid != '\0') {
          outl._0_2_ = (undefined2)sVar11;
          outl._2_2_ = (short)(sVar11 >> 0x10);
          outl._4_4_ = (uint32_t)(sVar11 >> 0x20);
          iVar4 = (*local_40)(local_48,zip->buf,sVar11,zip->buf,&outl);
          if (iVar4 < 0) goto LAB_0017721d;
          (*local_50)(local_58,zip->buf,sVar11);
        }
      }
      else {
        trad_enc_encrypt_update(&zip->tctx,zip->buf,sVar11,zip->buf,sVar11);
      }
      iVar4 = __archive_write_output(a,zip->buf,sVar11);
      if (iVar4 != 0) {
        return iVar4;
      }
      zip->entry_compressed_written = zip->entry_compressed_written + sVar11;
      zip->written_bytes = zip->written_bytes + sVar11;
      (zip->stream).deflate.next_out = zip->buf;
      if ((zip->stream).lzma.options.lp != 0) break;
      (zip->stream).lzma.options.lp = (uint32_t)zip->len_buf;
    }
    deflateEnd(&zip->stream);
  }
  else if ((cVar1 == COMPRESSION_LZMA) || (cVar1 == COMPRESSION_XZ)) {
    puVar18 = (undefined1 *)((long)&zip->stream + 0x78);
    local_40 = aes_ctr_update;
    local_48 = &zip->cctx;
    local_50 = __hmac_sha1_update;
    local_58 = &zip->hctx;
    do {
      iVar4 = lzma_code(puVar18,3);
      bVar17 = 1;
      if (iVar4 != 1) {
        if (iVar4 == 5) {
          return -0x1e;
        }
        bVar17 = 0;
      }
      sVar11 = zip->len_buf - (zip->stream).lzma.context.avail_out;
      if (zip->tctx_valid == '\0') {
        if (zip->cctx_valid != '\0') {
          outl._0_2_ = (undefined2)sVar11;
          outl._2_2_ = (short)(sVar11 >> 0x10);
          outl._4_4_ = (uint32_t)(sVar11 >> 0x20);
          iVar4 = (*local_40)(local_48,zip->buf,sVar11,zip->buf,&outl);
          if (iVar4 < 0) goto LAB_0017721d;
          (*local_50)(local_58,zip->buf,sVar11);
        }
      }
      else {
        trad_enc_encrypt_update(&zip->tctx,zip->buf,sVar11,zip->buf,sVar11);
      }
      iVar4 = __archive_write_output(a,zip->buf,sVar11);
      if (iVar4 != 0) {
        return iVar4;
      }
      zip->entry_compressed_written = zip->entry_compressed_written + sVar11;
      zip->written_bytes = zip->written_bytes + sVar11;
      (zip->stream).lzma.context.next_out = zip->buf;
      sVar11 = (zip->stream).lzma.context.avail_out;
      *(ulong *)((long)&zip->stream + 0x98) = (ulong)(uint)zip->len_buf;
    } while ((bool)(~bVar17 & sVar11 == 0));
    lzma_end(puVar18);
  }
  else if (cVar1 == COMPRESSION_ZSTD) {
    local_40 = aes_ctr_update;
    local_48 = &zip->cctx;
    local_50 = __hmac_sha1_update;
    local_58 = &zip->hctx;
    do {
      lVar6 = ZSTD_endStream((zip->stream).deflate.next_in,(undefined1 *)((long)&zip->stream + 0x20)
                            );
      if ((lVar6 != 0) && (iVar4 = ZSTD_isError(lVar6), iVar4 != 0)) {
        return -0x1e;
      }
      pcVar10 = (zip->stream).deflate.msg + (zip->len_buf - (zip->stream).deflate.total_out);
      if (zip->tctx_valid == '\0') {
        if (zip->cctx_valid != '\0') {
          outl._0_2_ = SUB82(pcVar10,0);
          outl._2_2_ = (short)((ulong)pcVar10 >> 0x10);
          outl._4_4_ = (uint32_t)((ulong)pcVar10 >> 0x20);
          iVar4 = (*local_40)(local_48,zip->buf,(size_t)pcVar10,zip->buf,&outl);
          if (iVar4 < 0) {
LAB_0017721d:
            archive_set_error(&a->archive,-1,"Failed to encrypt file");
            return -0x19;
          }
          (*local_50)(local_58,zip->buf,(size_t)pcVar10);
        }
      }
      else {
        trad_enc_encrypt_update(&zip->tctx,zip->buf,(size_t)pcVar10,zip->buf,(size_t)pcVar10);
      }
      iVar4 = __archive_write_output(a,zip->buf,(size_t)pcVar10);
      if (iVar4 != 0) {
        return iVar4;
      }
      zip->entry_compressed_written = (int64_t)(pcVar10 + zip->entry_compressed_written);
      zip->written_bytes = (int64_t)(pcVar10 + zip->written_bytes);
      (zip->stream).zstd.out.dst = zip->buf;
      pcVar10 = (char *)(zip->stream).deflate.total_out;
      (zip->stream).deflate.total_out = zip->len_buf;
    } while ((lVar6 != 0) && ((zip->stream).deflate.msg == pcVar10));
    ZSTD_freeCStream((zip->stream).deflate.next_in);
  }
  if (zip->hctx_valid != '\0') {
    hmac_len = 0x14;
    __hmac_sha1_final(&zip->hctx,(uint8_t *)&outl,&hmac_len);
    iVar4 = __archive_write_output(a,&outl,10);
    if (iVar4 != 0) {
      return iVar4;
    }
    zip->entry_compressed_written = zip->entry_compressed_written + 10;
    zip->written_bytes = zip->written_bytes + 10;
  }
  if ((zip->entry_flags & 8) != 0) {
    outl._0_2_ = 0x4b50;
    outl._2_2_ = 0x807;
    if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
      outl._4_4_ = zip->entry_crc32;
    }
    else {
      outl._4_4_ = 0;
    }
    lVar6 = zip->entry_compressed_written;
    uVar2 = zip->entry_uncompressed_written;
    uStack_70 = (undefined1)lVar6;
    uStack_6f = (undefined1)((ulong)lVar6 >> 8);
    uStack_6e = (undefined1)((ulong)lVar6 >> 0x10);
    uStack_6d = (undefined1)((ulong)lVar6 >> 0x18);
    if (((long)uVar2 < 0x100000000 && lVar6 < 0x100000000) && ((zip->flags & 2) == 0)) {
      puVar18 = &local_69;
      puVar13 = &local_6a;
      puVar14 = &local_6b;
      sVar12 = 0x18;
      sVar11 = 0x10;
      sVar9 = 8;
      puVar15 = &local_6c;
      uVar16 = uVar2;
      length = sVar11;
    }
    else {
      puVar18 = local_61;
      puVar13 = &local_62;
      puVar14 = &local_63;
      local_6c = (undefined1)((ulong)lVar6 >> 0x20);
      local_6b = (undefined1)((ulong)lVar6 >> 0x28);
      local_6a = (undefined1)((ulong)lVar6 >> 0x30);
      local_69 = (undefined1)((ulong)lVar6 >> 0x38);
      local_68 = (undefined1)uVar2;
      local_67 = (undefined1)(uVar2 >> 8);
      local_66 = (undefined1)(uVar2 >> 0x10);
      local_65 = (undefined1)(uVar2 >> 0x18);
      puVar15 = &local_64;
      uVar16 = uVar2 >> 0x20;
      length = 0x18;
      sVar12 = 0x38;
      sVar11 = 0x30;
      sVar9 = 0x28;
    }
    *puVar15 = (char)uVar16;
    *puVar14 = (char)(uVar2 >> sVar9);
    *puVar13 = (char)(uVar2 >> (sbyte)sVar11);
    *puVar18 = (char)(uVar2 >> sVar12);
    iVar4 = __archive_write_output(a,&outl,length);
    zip->written_bytes = zip->written_bytes + length;
    if (iVar4 != 0) {
      return -0x1e;
    }
  }
  wVar5 = archive_entry_mtime_is_set(zip->entry);
  if (wVar5 != L'\0') {
    tVar7 = archive_entry_mtime(zip->entry);
    puVar8 = cd_alloc(zip,9);
    if (puVar8 == (uchar *)0x0) goto LAB_0017713d;
    puVar8[4] = '\x01';
    puVar8[0] = 'U';
    puVar8[1] = 'T';
    puVar8[2] = '\x05';
    puVar8[3] = '\0';
    *(int *)(puVar8 + 5) = (int)tVar7;
  }
  if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
    *(uint32_t *)(zip->file_header + 0x10) = zip->entry_crc32;
  }
  else {
    puVar8 = zip->file_header;
    puVar8[0x10] = '\0';
    puVar8[0x11] = '\0';
    puVar8[0x12] = '\0';
    puVar8[0x13] = '\0';
  }
  *(int *)(zip->file_header + 0x14) = (int)zip->entry_compressed_written;
  *(int *)(zip->file_header + 0x18) = (int)zip->entry_uncompressed_written;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  *(int *)(zip->file_header + 0x2a) = (int)zip->entry_offset;
  if (zip->entry_compressed_written < 0xffffffff) {
    if (0xfffffffe < zip->entry_uncompressed_written) goto LAB_001770a1;
    if (0xffffffff < zip->entry_offset) {
      puVar18 = (undefined1 *)((long)&outl + 4);
      outl._0_2_ = 1;
      outl._2_2_ = 0;
      goto LAB_001770da;
    }
  }
  else {
    puVar18 = (undefined1 *)((long)&outl + 4);
    if (zip->entry_uncompressed_written < 0xffffffff) {
LAB_001770bf:
      outl._2_2_ = 0;
      outl._0_2_ = 1;
      puVar8 = zip->file_header;
      puVar8[0x14] = 0xff;
      puVar8[0x15] = 0xff;
      puVar8[0x16] = 0xff;
      puVar8[0x17] = 0xff;
      archive_le64enc(puVar18,zip->entry_compressed_written);
      puVar18 = puVar18 + 8;
    }
    else {
LAB_001770a1:
      outl._2_2_ = 0;
      outl._0_2_ = 1;
      puVar8 = zip->file_header;
      puVar8[0x18] = 0xff;
      puVar8[0x19] = 0xff;
      puVar8[0x1a] = 0xff;
      puVar8[0x1b] = 0xff;
      iVar3 = zip->entry_uncompressed_written;
      puVar18 = &local_6c;
      outl._4_4_ = (uint32_t)iVar3;
      uStack_70 = (undefined1)((ulong)iVar3 >> 0x20);
      uStack_6f = (undefined1)((ulong)iVar3 >> 0x28);
      uStack_6e = (undefined1)((ulong)iVar3 >> 0x30);
      uStack_6d = (undefined1)((ulong)iVar3 >> 0x38);
      if (0xfffffffe < zip->entry_compressed_written) goto LAB_001770bf;
    }
LAB_001770da:
    if (0xfffffffe < zip->entry_offset) {
      puVar8 = zip->file_header;
      puVar8[0x2a] = 0xff;
      puVar8[0x2b] = 0xff;
      puVar8[0x2c] = 0xff;
      puVar8[0x2d] = 0xff;
      archive_le64enc(puVar18,zip->entry_offset);
      puVar18 = puVar18 + 8;
    }
    outl._2_2_ = (short)puVar18 - ((short)&outl + 4);
    puVar8 = cd_alloc(zip,(long)puVar18 - (long)&outl);
    if (puVar8 == (uchar *)0x0) {
LAB_0017713d:
      archive_set_error(&a->archive,0xc,"Can\'t allocate zip data");
      return -0x1e;
    }
    memcpy(puVar8,&outl,(long)puVar18 - (long)&outl);
    puVar8 = zip->file_header;
    if (*(ushort *)(puVar8 + 6) < 0x2d) {
      puVar8[6] = '-';
      puVar8[7] = '\0';
    }
  }
  if (zip->cctx_valid == '\0') {
    puVar8 = zip->file_header;
  }
  else {
    puVar8 = zip->file_header;
    if (zip->aes_vendor == 2) {
      puVar8[0x10] = '\0';
      puVar8[0x11] = '\0';
      puVar8[0x12] = '\0';
      puVar8[0x13] = '\0';
      goto LAB_001771a3;
    }
  }
  *(uint32_t *)(puVar8 + 0x10) = zip->entry_crc32;
LAB_001771a3:
  lVar6 = zip->entry_compressed_written;
  if (0xfffffffe < lVar6) {
    lVar6 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x14) = (int)lVar6;
  lVar6 = zip->entry_uncompressed_written;
  if (0xfffffffe < lVar6) {
    lVar6 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x18) = (int)lVar6;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  lVar6 = 0xffffffff;
  if (zip->entry_offset < 0xffffffff) {
    lVar6 = zip->entry_offset;
  }
  *(int *)(zip->file_header + 0x2a) = (int)lVar6;
  return 0;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;
#if defined(HAVE_BZLIB_H) || (defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream) || HAVE_LZMA_H
	char finishing;
#endif

	switch (zip->entry_compression) {
#ifdef HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		for (;;) {
			size_t remainder;

			ret = deflate(&zip->stream.deflate, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.deflate.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.deflate.next_out = zip->buf;
			if (zip->stream.deflate.avail_out != 0)
				break;
			zip->stream.deflate.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream.deflate);
		break;
#endif
#ifdef HAVE_BZLIB_H
	case COMPRESSION_BZIP2:
		finishing = 1;
		do {
			size_t remainder;

			ret = BZ2_bzCompress(&zip->stream.bzip2, BZ_FINISH);
			if (ret == BZ_STREAM_END)
				finishing = 0;
			else if (ret != BZ_RUN_OK && ret != BZ_FINISH_OK)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.bzip2.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.bzip2.next_out = (char*)zip->buf;
			if (zip->stream.bzip2.avail_out != 0)
				finishing = 0;
			zip->stream.bzip2.avail_out = (unsigned int)zip->len_buf;
		} while (finishing);
		BZ2_bzCompressEnd(&zip->stream.bzip2);
		break;
#endif
#if defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream
	case COMPRESSION_ZSTD:
		finishing = 1;
		do {
			size_t remainder;

			size_t zret = ZSTD_endStream(zip->stream.zstd.context, &zip->stream.zstd.out);
			if (zret == 0)
				finishing = 0;
			else if (ZSTD_isError(zret))
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - (zip->stream.zstd.out.size - zip->stream.zstd.out.pos);
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.zstd.out.dst = zip->buf;
			if (zip->stream.zstd.out.pos != zip->stream.zstd.out.size)
				finishing = 0;
			zip->stream.zstd.out.size = zip->len_buf;
		} while (finishing);
		ZSTD_freeCStream(zip->stream.zstd.context);
		break;
#endif
#ifdef HAVE_LZMA_H
	/* XZ and LZMA share clean-up code */
	case COMPRESSION_LZMA:
	case COMPRESSION_XZ:
		finishing = 1;
		do {
			size_t remainder;

			ret = lzma_code(&zip->stream.lzma.context, LZMA_FINISH);
			if (ret == LZMA_STREAM_END)
				finishing = 0;
			else if (ret == LZMA_MEM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.lzma.context.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.lzma.context.next_out = zip->buf;
			if (zip->stream.lzma.context.avail_out != 0)
				finishing = 0;
			zip->stream.lzma.context.avail_out = (unsigned int)zip->len_buf;
		} while (finishing);
		lzma_end(&zip->stream.lzma.context);
		break;
#endif
	default:
		break;
	}
	if (zip->hctx_valid) {
		uint8_t hmac[20];
		size_t hmac_len = 20;

		archive_hmac_sha1_final(&zip->hctx, hmac, &hmac_len);
		ret = __archive_write_output(a, hmac, AUTH_CODE_SIZE);
		if (ret != ARCHIVE_OK)
			return (ret);
		zip->entry_compressed_written += AUTH_CODE_SIZE;
		zip->written_bytes += AUTH_CODE_SIZE;
	}

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
			archive_le32enc(d + 4, 0);/* no CRC.*/
		else
			archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_compressed_written > ZIP_4GB_MAX
		    || zip->entry_uncompressed_written > ZIP_4GB_MAX
		    || zip->flags & ZIP_FLAG_FORCE_ZIP64) {
			archive_le64enc(d + 8,
				(uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16,
				(uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8,
				(uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12,
				(uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* UT timestamp: Info-Zip specifies that _only_ the mtime should
	 * be recorded here; ctime and atime are also included in the
	 * local file descriptor. */
	if (archive_entry_mtime_is_set(zip->entry)) {
		unsigned char ut[9];
		unsigned char *u = ut, *ud;
		memcpy(u, "UT\005\000\001", 5);
		u += 5;
		archive_le32enc(u, (uint32_t)archive_entry_mtime(zip->entry));
		u += 4;
		ud = cd_alloc(zip, u - ut);
		if (ud == NULL) {
			archive_set_error(&a->archive, ENOMEM,
					  "Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(ud, ut, u - ut);
	}

	/* Fill in size information in the central directory entry. */
	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	/* Truncate to 32 bits; we'll fix up below. */
	archive_le32enc(zip->file_header + 20, (uint32_t)zip->entry_compressed_written);
	archive_le32enc(zip->file_header + 24, (uint32_t)zip->entry_uncompressed_written);
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42, (uint32_t)zip->entry_offset);

	/* If any of the values immediately above are too large, we'll
	 * need to put the corresponding value in a Zip64 extra field
	 * and set the central directory value to 0xffffffff as a flag. */
	if (zip->entry_compressed_written >= ZIP_4GB_MAX
	    || zip->entry_uncompressed_written >= ZIP_4GB_MAX
	    || zip->entry_offset > ZIP_4GB_MAX) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 24, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 20, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 42, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, (uint16_t)(z - (zip64 + 4)));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
		(uint32_t)zipmin(zip->entry_compressed_written,
				 ZIP_4GB_MAX));
	archive_le32enc(zip->file_header + 24,
		(uint32_t)zipmin(zip->entry_uncompressed_written,
				 ZIP_4GB_MAX));
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42,
		(uint32_t)zipmin(zip->entry_offset,
				 ZIP_4GB_MAX));

	return (ARCHIVE_OK);
}